

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

void drmp3_L3_imdct36(float *grbuf,float *overlap,float *window,int nbands)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float sum;
  float ovl;
  drmp3_f4 vsum;
  drmp3_f4 vw1;
  drmp3_f4 vw0;
  drmp3_f4 vr1;
  drmp3_f4 vr0;
  drmp3_f4 vs;
  drmp3_f4 vc;
  drmp3_f4 vovl;
  float si [9];
  float local_268 [2];
  float co [9];
  int j;
  int i;
  int nbands_local;
  float *window_local;
  float *overlap_local;
  float *grbuf_local;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  window_local = overlap;
  overlap_local = grbuf;
  for (co[7] = 0.0; (int)co[7] < nbands; co[7] = (float)((int)co[7] + 1)) {
    local_268[0] = -*overlap_local;
    vovl[2] = overlap_local[0x11];
    for (co[8] = 0.0; (int)co[8] < 4; co[8] = (float)((int)co[8] + 1)) {
      vovl[(long)((int)co[8] * -2 + 8) + 2] =
           overlap_local[(int)co[8] * 4 + 1] - overlap_local[(int)co[8] * 4 + 2];
      local_268[(int)co[8] * 2 + 1] =
           overlap_local[(int)co[8] * 4 + 1] + overlap_local[(int)co[8] * 4 + 2];
      vovl[(long)((int)co[8] * -2 + 7) + 2] =
           overlap_local[(int)co[8] * 4 + 4] - overlap_local[(int)co[8] * 4 + 3];
      local_268[(int)co[8] * 2 + 2] =
           -(overlap_local[(int)co[8] * 4 + 3] + overlap_local[(int)co[8] * 4 + 4]);
    }
    drmp3_L3_dct3_9(local_268);
    drmp3_L3_dct3_9(vovl + 2);
    vovl[3] = -vovl[3];
    si[1] = -si[1];
    si[3] = -si[3];
    si[5] = -si[5];
    co[8] = 0.0;
    iVar6 = drmp3_have_simd();
    if (iVar6 != 0) {
      for (; (int)co[8] < 8; co[8] = (float)((int)co[8] + 4)) {
        uVar1 = *(undefined8 *)(window_local + (int)co[8]);
        vovl._0_8_ = *(undefined8 *)(window_local + (int)co[8] + 2);
        uVar2 = *(undefined8 *)(window + (int)co[8]);
        uVar3 = *(undefined8 *)(window + (int)co[8] + 2);
        uVar4 = *(undefined8 *)(window + (long)(int)co[8] + 9);
        uVar5 = *(undefined8 *)(window + (long)(int)co[8] + 9 + 2);
        local_18 = (float)*(undefined8 *)(local_268 + (int)co[8]);
        fStack_14 = (float)((ulong)*(undefined8 *)(local_268 + (int)co[8]) >> 0x20);
        fStack_10 = (float)*(undefined8 *)(co + (int)co[8]);
        fStack_c = (float)((ulong)*(undefined8 *)(co + (int)co[8]) >> 0x20);
        local_28 = (float)*(undefined8 *)(drmp3_L3_imdct36::g_twid9 + (long)(int)co[8] + 9);
        fStack_24 = (float)((ulong)*(undefined8 *)(drmp3_L3_imdct36::g_twid9 + (long)(int)co[8] + 9)
                           >> 0x20);
        fStack_20 = (float)*(undefined8 *)(drmp3_L3_imdct36::g_twid9 + (long)(int)co[8] + 0xb);
        fStack_1c = (float)((ulong)*(undefined8 *)
                                    (drmp3_L3_imdct36::g_twid9 + (long)(int)co[8] + 0xb) >> 0x20);
        local_38 = (float)*(undefined8 *)(vovl + (long)(int)co[8] + 2);
        fStack_34 = (float)((ulong)*(undefined8 *)(vovl + (long)(int)co[8] + 2) >> 0x20);
        fStack_30 = (float)*(undefined8 *)(si + (int)co[8]);
        fStack_2c = (float)((ulong)*(undefined8 *)(si + (int)co[8]) >> 0x20);
        local_48 = (float)*(undefined8 *)(drmp3_L3_imdct36::g_twid9 + (int)co[8]);
        fStack_44 = (float)((ulong)*(undefined8 *)(drmp3_L3_imdct36::g_twid9 + (int)co[8]) >> 0x20);
        fStack_40 = (float)*(undefined8 *)(drmp3_L3_imdct36::g_twid9 + (long)(int)co[8] + 2);
        fStack_3c = (float)((ulong)*(undefined8 *)(drmp3_L3_imdct36::g_twid9 + (long)(int)co[8] + 2)
                           >> 0x20);
        fVar7 = local_18 * local_28 + local_38 * local_48;
        fVar8 = fStack_14 * fStack_24 + fStack_34 * fStack_44;
        fVar9 = fStack_10 * fStack_20 + fStack_30 * fStack_40;
        fVar10 = fStack_c * fStack_1c + fStack_2c * fStack_3c;
        *(ulong *)(window_local + (int)co[8]) =
             CONCAT44(fStack_14 * fStack_44 - fStack_34 * fStack_24,
                      local_18 * local_48 - local_38 * local_28);
        *(ulong *)(window_local + (int)co[8] + 2) =
             CONCAT44(fStack_c * fStack_3c - fStack_2c * fStack_1c,
                      fStack_10 * fStack_40 - fStack_30 * fStack_20);
        local_98 = (float)uVar1;
        fStack_94 = (float)((ulong)uVar1 >> 0x20);
        fStack_90 = (float)vovl._0_8_;
        fStack_8c = SUB84(vovl._0_8_,4);
        local_a8 = (float)uVar2;
        fStack_a4 = (float)((ulong)uVar2 >> 0x20);
        fStack_a0 = (float)uVar3;
        fStack_9c = (float)((ulong)uVar3 >> 0x20);
        local_c8 = (float)uVar4;
        fStack_c4 = (float)((ulong)uVar4 >> 0x20);
        fStack_c0 = (float)uVar5;
        fStack_bc = (float)((ulong)uVar5 >> 0x20);
        *(ulong *)(overlap_local + (int)co[8]) =
             CONCAT44(fStack_94 * fStack_a4 - fVar8 * fStack_c4,
                      local_98 * local_a8 - fVar7 * local_c8);
        *(ulong *)(overlap_local + (int)co[8] + 2) =
             CONCAT44(fStack_8c * fStack_9c - fVar10 * fStack_bc,
                      fStack_90 * fStack_a0 - fVar9 * fStack_c0);
        *(ulong *)(overlap_local + (0xe - (long)(int)co[8])) =
             CONCAT44(fStack_90 * fStack_c0 + fVar9 * fStack_a0,
                      fStack_8c * fStack_bc + fVar10 * fStack_9c);
        *(ulong *)(overlap_local + (0x10 - (long)(int)co[8])) =
             CONCAT44(local_98 * local_c8 + fVar7 * local_a8,
                      fStack_94 * fStack_c4 + fVar8 * fStack_a4);
      }
    }
    for (; (int)co[8] < 9; co[8] = (float)((int)co[8] + 1)) {
      fVar7 = window_local[(int)co[8]];
      fVar8 = local_268[(int)co[8]] * drmp3_L3_imdct36::g_twid9[(int)co[8] + 9] +
              vovl[(long)(int)co[8] + 2] * drmp3_L3_imdct36::g_twid9[(int)co[8]];
      window_local[(int)co[8]] =
           local_268[(int)co[8]] * drmp3_L3_imdct36::g_twid9[(int)co[8]] +
           -(vovl[(long)(int)co[8] + 2] * drmp3_L3_imdct36::g_twid9[(int)co[8] + 9]);
      overlap_local[(int)co[8]] = fVar7 * window[(int)co[8]] + -(fVar8 * window[(int)co[8] + 9]);
      overlap_local[0x11 - (int)co[8]] = fVar7 * window[(int)co[8] + 9] + fVar8 * window[(int)co[8]]
      ;
    }
    overlap_local = overlap_local + 0x12;
    window_local = window_local + 9;
  }
  return;
}

Assistant:

static void drmp3_L3_imdct36(float *grbuf, float *overlap, const float *window, int nbands)
{
    int i, j;
    static const float g_twid9[18] = {
        0.73727734f,0.79335334f,0.84339145f,0.88701083f,0.92387953f,0.95371695f,0.97629601f,0.99144486f,0.99904822f,0.67559021f,0.60876143f,0.53729961f,0.46174861f,0.38268343f,0.30070580f,0.21643961f,0.13052619f,0.04361938f
    };

    for (j = 0; j < nbands; j++, grbuf += 18, overlap += 9)
    {
        float co[9], si[9];
        co[0] = -grbuf[0];
        si[0] = grbuf[17];
        for (i = 0; i < 4; i++)
        {
            si[8 - 2*i] =   grbuf[4*i + 1] - grbuf[4*i + 2];
            co[1 + 2*i] =   grbuf[4*i + 1] + grbuf[4*i + 2];
            si[7 - 2*i] =   grbuf[4*i + 4] - grbuf[4*i + 3];
            co[2 + 2*i] = -(grbuf[4*i + 3] + grbuf[4*i + 4]);
        }
        drmp3_L3_dct3_9(co);
        drmp3_L3_dct3_9(si);

        si[1] = -si[1];
        si[3] = -si[3];
        si[5] = -si[5];
        si[7] = -si[7];

        i = 0;

#if DRMP3_HAVE_SIMD
        if (drmp3_have_simd()) for (; i < 8; i += 4)
        {
            drmp3_f4 vovl = DRMP3_VLD(overlap + i);
            drmp3_f4 vc = DRMP3_VLD(co + i);
            drmp3_f4 vs = DRMP3_VLD(si + i);
            drmp3_f4 vr0 = DRMP3_VLD(g_twid9 + i);
            drmp3_f4 vr1 = DRMP3_VLD(g_twid9 + 9 + i);
            drmp3_f4 vw0 = DRMP3_VLD(window + i);
            drmp3_f4 vw1 = DRMP3_VLD(window + 9 + i);
            drmp3_f4 vsum = DRMP3_VADD(DRMP3_VMUL(vc, vr1), DRMP3_VMUL(vs, vr0));
            DRMP3_VSTORE(overlap + i, DRMP3_VSUB(DRMP3_VMUL(vc, vr0), DRMP3_VMUL(vs, vr1)));
            DRMP3_VSTORE(grbuf + i, DRMP3_VSUB(DRMP3_VMUL(vovl, vw0), DRMP3_VMUL(vsum, vw1)));
            vsum = DRMP3_VADD(DRMP3_VMUL(vovl, vw1), DRMP3_VMUL(vsum, vw0));
            DRMP3_VSTORE(grbuf + 14 - i, DRMP3_VREV(vsum));
        }
#endif
        for (; i < 9; i++)
        {
            float ovl  = overlap[i];
            float sum  = co[i]*g_twid9[9 + i] + si[i]*g_twid9[0 + i];
            overlap[i] = co[i]*g_twid9[0 + i] - si[i]*g_twid9[9 + i];
            grbuf[i]      = ovl*window[0 + i] - sum*window[9 + i];
            grbuf[17 - i] = ovl*window[9 + i] + sum*window[0 + i];
        }
    }
}